

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_unlink_leafref_node(lyd_node_term *node,lyd_node_term *leafref_node)

{
  lysc_node *plVar1;
  uint16_t uVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lyd_node_term **pplVar6;
  lyd_node_term *plVar7;
  LY_ERR LVar8;
  lyd_node_term *plVar9;
  lyd_leafref_links_rec *rec;
  
  if (node == (lyd_node_term *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea6,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  if (leafref_node == (lyd_node_term *)0x0) {
    __assert_fail("leafref_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0xea7,
                  "LY_ERR lyd_unlink_leafref_node(const struct lyd_node_term *, const struct lyd_node_term *)"
                 );
  }
  plVar1 = (node->field_0).node.schema;
  if (plVar1 == (lysc_node *)0x0) {
    plVar5 = (lys_module *)&node[1].field_0.node.next;
  }
  else {
    plVar5 = plVar1->module;
  }
  uVar2 = ly_ctx_get_options(plVar5->ctx);
  if ((uVar2 >> 10 & 1) == 0) {
    LVar3 = LY_EDENIED;
  }
  else {
    LVar3 = lyd_get_or_create_leafref_links_record(node,&rec,'\0');
    if (LVar3 != LY_ENOTFOUND) {
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      pplVar6 = rec->leafref_nodes;
      plVar7 = (lyd_node_term *)0x0;
      while( true ) {
        if (pplVar6 == (lyd_node_term **)0x0) {
          plVar9 = (lyd_node_term *)0x0;
        }
        else {
          plVar9 = pplVar6[-1];
        }
        if (plVar9 <= plVar7) {
          if (pplVar6 != (lyd_node_term **)0x0) goto LAB_00123d88;
          goto LAB_00123d8f;
        }
        if (pplVar6[(long)plVar7] == leafref_node) break;
        plVar7 = (lyd_node_term *)((long)&plVar7->field_0 + 1);
      }
      plVar9 = (lyd_node_term *)((long)&pplVar6[-1][-1].value.field_2 + 0x17);
      if (plVar9 != plVar7) {
        pplVar6[(long)plVar7] = pplVar6[(long)(&pplVar6[-1][-1].value.field_2.boolean + 0x17)];
        pplVar6 = rec->leafref_nodes;
        plVar9 = (lyd_node_term *)((long)&pplVar6[-1][-1].value.field_2 + 0x17);
      }
      pplVar6[-1] = plVar9;
LAB_00123d88:
      if (pplVar6[-1] == (lyd_node_term *)0x0) {
LAB_00123d8f:
        if ((rec->target_nodes == (lyd_node_term **)0x0) ||
           (rec->target_nodes[-1] == (lyd_node_term *)0x0)) {
          lyd_free_leafref_nodes(node);
        }
      }
    }
    LVar8 = LY_SUCCESS;
    LVar4 = lyd_get_or_create_leafref_links_record(leafref_node,&rec,'\0');
    LVar3 = LVar8;
    if ((LVar4 != LY_ENOTFOUND) && (LVar3 = LVar4, LVar4 == LY_SUCCESS)) {
      pplVar6 = rec->target_nodes;
      plVar7 = (lyd_node_term *)0x0;
      while( true ) {
        if (pplVar6 == (lyd_node_term **)0x0) {
          plVar9 = (lyd_node_term *)0x0;
        }
        else {
          plVar9 = pplVar6[-1];
        }
        if (plVar9 <= plVar7) goto LAB_00123e17;
        if (pplVar6[(long)plVar7] == node) break;
        plVar7 = (lyd_node_term *)((long)&plVar7->field_0 + 1);
      }
      plVar9 = (lyd_node_term *)((long)&pplVar6[-1][-1].value.field_2 + 0x17);
      if (plVar9 != plVar7) {
        pplVar6[(long)plVar7] = pplVar6[(long)(&pplVar6[-1][-1].value.field_2.boolean + 0x17)];
        pplVar6 = rec->target_nodes;
        plVar9 = (lyd_node_term *)((long)&pplVar6[-1][-1].value.field_2 + 0x17);
      }
      pplVar6[-1] = plVar9;
LAB_00123e17:
      if (((rec->leafref_nodes == (lyd_node_term **)0x0) ||
          (LVar3 = LVar8, rec->leafref_nodes[-1] == (lyd_node_term *)0x0)) &&
         ((pplVar6 == (lyd_node_term **)0x0 || (LVar3 = LVar8, pplVar6[-1] == (lyd_node_term *)0x0))
         )) {
        lyd_free_leafref_nodes(leafref_node);
        LVar3 = LVar8;
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
lyd_unlink_leafref_node(const struct lyd_node_term *node, const struct lyd_node_term *leafref_node)
{
    LY_ERR ret;
    struct lyd_leafref_links_rec *rec;

    assert(node);
    assert(leafref_node);

    if (!(ly_ctx_get_options(LYD_CTX(node)) & LY_CTX_LEAFREF_LINKING)) {
        return LY_EDENIED;
    }

    /* remove link from target node to leafref node */
    ret = lyd_get_or_create_leafref_links_record(node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->leafref_nodes, leafref_node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    /* remove link from leafref node to target node */
    ret = lyd_get_or_create_leafref_links_record(leafref_node, &rec, 0);
    if (ret == LY_SUCCESS) {
        LY_ARRAY_REMOVE_VALUE(rec->target_nodes, node);
        if ((LY_ARRAY_COUNT(rec->leafref_nodes) == 0) && (LY_ARRAY_COUNT(rec->target_nodes) == 0)) {
            lyd_free_leafref_nodes(leafref_node);
        }
    } else if (ret != LY_ENOTFOUND) {
        return ret;
    }

    return LY_SUCCESS;
}